

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.cc
# Opt level: O1

void __thiscall
webrtc::SplittingFilter::ThreeBandsAnalysis
          (SplittingFilter *this,IFChannelBuffer *data,IFChannelBuffer *bands)

{
  ThreeBandFilterBank *this_00;
  float *in;
  size_t length;
  ChannelBuffer<float> *t;
  string *result;
  pointer puVar1;
  ChannelBuffer<float> *pCVar2;
  float **ppfVar3;
  size_t channel;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  local_1a8._0_8_ =
       (long)(this->three_band_filter_banks_).
             super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->three_band_filter_banks_).
             super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_1b0 = (data->ibuf_).num_channels_;
  if (local_1a8._0_8_ == local_1b0) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1b0,
                        "three_band_filter_banks_.size() == data->num_channels()");
  }
  if (result == (string *)0x0) {
    puVar1 = (this->three_band_filter_banks_).
             super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->three_band_filter_banks_).
        super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
      channel = 0;
      do {
        this_00 = puVar1[channel]._M_t.
                  super___uniq_ptr_impl<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_webrtc::ThreeBandFilterBank_*,_std::default_delete<webrtc::ThreeBandFilterBank>_>
                  .super__Head_base<0UL,_webrtc::ThreeBandFilterBank_*,_false>._M_head_impl;
        pCVar2 = IFChannelBuffer::fbuf_const(data);
        ppfVar3 = ChannelBuffer<float>::channels(pCVar2,0);
        in = ppfVar3[channel];
        length = (data->ibuf_).num_frames_;
        pCVar2 = IFChannelBuffer::fbuf(bands);
        ppfVar3 = ChannelBuffer<float>::bands(pCVar2,channel);
        ThreeBandFilterBank::Analysis(this_00,in,length,ppfVar3);
        channel = channel + 1;
        puVar1 = (this->three_band_filter_banks_).
                 super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (channel < (ulong)((long)(this->three_band_filter_banks_).
                                       super__Vector_base<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >>
                                3));
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
             ,0x58,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void SplittingFilter::ThreeBandsAnalysis(const IFChannelBuffer* data,
                                         IFChannelBuffer* bands) {
  RTC_DCHECK_EQ(three_band_filter_banks_.size(), data->num_channels());
  for (size_t i = 0; i < three_band_filter_banks_.size(); ++i) {
    three_band_filter_banks_[i]->Analysis(data->fbuf_const()->channels()[i],
                                          data->num_frames(),
                                          bands->fbuf()->bands(i));
  }
}